

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

Vec3f * __thiscall Model::point(Model *this,int i)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int i_local;
  Model *this_local;
  
  bVar1 = false;
  if (-1 < i) {
    iVar2 = nverts(this);
    bVar1 = i < iVar2;
  }
  if (!bVar1) {
    __assert_fail("i>=0 && i<nverts()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                  ,0x4d,"Vec3f &Model::point(int)");
  }
  pvVar3 = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[](&this->verts,(long)i)
  ;
  return pvVar3;
}

Assistant:

Vec3f &Model::point(int i) {
    assert(i>=0 && i<nverts());
    return verts[i];
}